

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* default_search_paths_abi_cxx11_(void)

{
  size_type sVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  size_type sVar5;
  void *pvVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  size_type local_148;
  size_t secondtolastslash;
  size_t lastslash;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined4 local_10c;
  char *local_108;
  Dl_info rInfo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  size_type local_70;
  ssize_t size;
  allocator_type local_51;
  undefined1 local_50 [8];
  vector<char,_std::allocator<char>_> buf;
  string exepath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *paths;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_RDI);
  std::__cxx11::string::string
            ((string *)&buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_50,0x800,&local_51);
  std::allocator<char>::~allocator(&local_51);
  local_70 = 0xffffffffffffffff;
  pvVar4 = std::vector<char,_std::allocator<char>_>::front
                     ((vector<char,_std::allocator<char>_> *)local_50);
  sVar5 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)local_50);
  local_70 = readlink("/proc/self/exe",pvVar4,sVar5);
  if (-1 < (long)local_70) {
    pvVar4 = std::vector<char,_std::allocator<char>_>::front
                       ((vector<char,_std::allocator<char>_> *)local_50);
    sVar1 = local_70;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,pvVar4,sVar1,&local_91);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  if (bVar2) {
    pvVar4 = std::vector<char,_std::allocator<char>_>::front
                       ((vector<char,_std::allocator<char>_> *)local_50);
    sVar5 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_50);
    local_70 = readlink("/proc/curproc/file",pvVar4,sVar5);
    if (-1 < (long)local_70) {
      pvVar4 = std::vector<char,_std::allocator<char>_>::front
                         ((vector<char,_std::allocator<char>_> *)local_50);
      sVar1 = local_70;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b8,pvVar4,sVar1,&local_b9);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
    }
  }
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  if (bVar2) {
    pvVar4 = std::vector<char,_std::allocator<char>_>::front
                       ((vector<char,_std::allocator<char>_> *)local_50);
    sVar5 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_50);
    local_70 = readlink("/proc/self/path/a.out",pvVar4,sVar5);
    if (-1 < (long)local_70) {
      pvVar4 = std::vector<char,_std::allocator<char>_>::front
                         ((vector<char,_std::allocator<char>_> *)local_50);
      sVar1 = local_70;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_e0,pvVar4,sVar1,(allocator<char> *)((long)&rInfo.dli_saddr + 7));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&rInfo.dli_saddr + 7));
    }
  }
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  if (bVar2) {
    memset(&local_108,0,0x20);
    pvVar6 = cast_module_symbol(default_search_paths_abi_cxx11_);
    iVar3 = dladdr(pvVar6,&local_108);
    if ((iVar3 == 0) || (local_108 == (char *)0x0)) goto LAB_00563120;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,local_108,(allocator<char> *)((long)&lastslash + 7));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator((allocator<char> *)((long)&lastslash + 7));
  }
  secondtolastslash =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,'/',
                  0xffffffffffffffff);
  local_148 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,'/'
                         ,secondtolastslash - 1);
  if (secondtolastslash != 0xffffffffffffffff) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_168,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,0,
               secondtolastslash + 1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_RDI,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
  }
  if (local_148 != 0xffffffffffffffff) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_1a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,0,local_148);
    std::operator+(&local_188,&local_1a8,"/lib/chaiscript/");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_RDI,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
  }
LAB_00563120:
  local_10c = 1;
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_50)
  ;
  std::__cxx11::string::~string
            ((string *)&buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  return in_RDI;
}

Assistant:

std::vector<std::string> default_search_paths() {
  std::vector<std::string> paths;

#ifndef CHAISCRIPT_NO_DYNLOAD
#ifdef CHAISCRIPT_WINDOWS // force no unicode
  CHAR path[4096];
  int size = GetModuleFileNameA(nullptr, path, sizeof(path) - 1);

  std::string exepath(path, size);

  size_t lastslash = exepath.rfind('\\');
  size_t secondtolastslash = exepath.rfind('\\', lastslash - 1);
  if (lastslash != std::string::npos) {
    paths.push_back(exepath.substr(0, lastslash));
  }

  if (secondtolastslash != std::string::npos) {
    return {exepath.substr(0, secondtolastslash) + "\\lib\\chaiscript\\"};
  }
#else

  std::string exepath;

  std::vector<char> buf(2048);
  ssize_t size = -1;

  if ((size = readlink("/proc/self/exe", &buf.front(), buf.size())) >= 0) {
    exepath = std::string(&buf.front(), static_cast<size_t>(size));
  }

  if (exepath.empty()) {
    if ((size = readlink("/proc/curproc/file", &buf.front(), buf.size())) >= 0) {
      exepath = std::string(&buf.front(), static_cast<size_t>(size));
    }
  }

  if (exepath.empty()) {
    if ((size = readlink("/proc/self/path/a.out", &buf.front(), buf.size())) >= 0) {
      exepath = std::string(&buf.front(), static_cast<size_t>(size));
    }
  }

  if (exepath.empty()) {
    Dl_info rInfo;
    memset(&rInfo, 0, sizeof(rInfo));
    if (dladdr(cast_module_symbol(&default_search_paths), &rInfo) == 0 || rInfo.dli_fname == nullptr) {
      return paths;
    }

    exepath = std::string(rInfo.dli_fname);
  }

  size_t lastslash = exepath.rfind('/');

  size_t secondtolastslash = exepath.rfind('/', lastslash - 1);
  if (lastslash != std::string::npos) {
    paths.push_back(exepath.substr(0, lastslash + 1));
  }

  if (secondtolastslash != std::string::npos) {
    paths.push_back(exepath.substr(0, secondtolastslash) + "/lib/chaiscript/");
  }
#endif
#endif // ifndef CHAISCRIPT_NO_DYNLOAD

  return paths;
}